

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O2

void sylvan_rehash_all_CALL(WorkerP *w,Task *__dq_head)

{
  TD_llmsset_clear_hashes *t;
  undefined1 local_48 [64];
  
  local_48._0_8_ = llmsset_clear_hashes_WRAP;
  local_48._8_8_ = (__pointer_type)0x1;
  local_48._16_8_ = nodes;
  lace_run_task((Task *)local_48);
  local_48._0_8_ = llmsset_rehash_WRAP;
  local_48._8_8_ = (__pointer_type)0x1;
  local_48._16_8_ = nodes;
  lace_run_task((Task *)local_48);
  if (local_48._16_4_ == 0) {
    return;
  }
  fwrite("sylvan_gc_rehash error: not all nodes could be rehashed!\n",0x39,1,_stderr);
  exit(1);
}

Assistant:

VOID_TASK_IMPL_0(sylvan_rehash_all)
{
    // clear hash array
    llmsset_clear_hashes(nodes);

    // rehash marked nodes
    if (llmsset_rehash(nodes) != 0) {
        fprintf(stderr, "sylvan_gc_rehash error: not all nodes could be rehashed!\n");
        exit(1);
    }
}